

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadTest.cpp
# Opt level: O0

void __thiscall ThreadParser::ThreadParser(ThreadParser *this)

{
  XercesDOMParser *pXVar1;
  HandlerBase *this_00;
  SAXParser *pSVar2;
  SAXHandler *this_01;
  SAX2XMLReader *pSVar3;
  SAX2Handler *this_02;
  ulong in_RSI;
  ErrorHandler *local_c8;
  ContentHandler *local_b0;
  ErrorHandler *local_88;
  DocumentHandler *local_70;
  ErrorHandler *local_50;
  ThreadParser *this_local;
  
  this->fSAXParser = (SAXParser *)0x0;
  this->fSAX2Parser = (SAX2XMLReader *)0x0;
  this->fXercesDOMParser = (XercesDOMParser *)0x0;
  this->fSAXHandler = (SAXHandler *)0x0;
  this->fSAX2Handler = (SAX2Handler *)0x0;
  this->fDOMErrorHandler = (ErrorHandler *)0x0;
  this->fDoc = (DOMDocument *)0x0;
  this->fCheckSum = 0;
  if ((gRunInfo.dom & 1U) == 0) {
    if ((gRunInfo.sax & 1U) == 0) {
      if (gp == (XMLGrammarPool *)0x0) {
        pSVar3 = (SAX2XMLReader *)
                 xercesc_4_0::XMLReaderFactory::createXMLReader
                           (xercesc_4_0::XMLPlatformUtils::fgMemoryManager,(XMLGrammarPool *)0x0);
        this->fSAX2Parser = pSVar3;
      }
      else {
        pSVar3 = (SAX2XMLReader *)xercesc_4_0::XMLReaderFactory::createXMLReader(gpMemMgr,gp);
        this->fSAX2Parser = pSVar3;
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesCacheGrammarFromParse,1);
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesUseCachedGrammarInParse,1);
      }
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpaces,
                 (ulong)(gRunInfo.doNamespaces & 1));
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesSchema,
                 (ulong)(gRunInfo.doSchema & 1));
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesHandleMultipleImports,1);
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesSchemaFullChecking,
                 (ulong)(gRunInfo.schemaFullChecking & 1));
      if (gRunInfo.valScheme == Val_Never) {
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,0);
      }
      else if (gRunInfo.valScheme == Val_Auto) {
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesDynamic,1);
      }
      else {
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreValidation,1);
        (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                  (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgXercesDynamic,0);
      }
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xc])
                (this->fSAX2Parser,&xercesc_4_0::XMLUni::fgSAX2CoreNameSpacePrefixes,
                 (ulong)(gRunInfo.doNamespacePrefixes & 1));
      this_02 = (SAX2Handler *)operator_new(0x38);
      (this_02->super_DefaultHandler).super_LexicalHandler._vptr_LexicalHandler = (_func_int **)0x0;
      (this_02->super_DefaultHandler).super_DeclHandler._vptr_DeclHandler = (_func_int **)0x0;
      (this_02->super_DefaultHandler).super_ContentHandler._vptr_ContentHandler = (_func_int **)0x0;
      (this_02->super_DefaultHandler).super_ErrorHandler._vptr_ErrorHandler = (_func_int **)0x0;
      (this_02->super_DefaultHandler).super_EntityResolver._vptr_EntityResolver = (_func_int **)0x0;
      (this_02->super_DefaultHandler).super_DTDHandler._vptr_DTDHandler = (_func_int **)0x0;
      this_02->SAX2Instance = (ThreadParser *)0x0;
      SAX2Handler::SAX2Handler(this_02);
      this->fSAX2Handler = this_02;
      this->fSAX2Handler->SAX2Instance = this;
      local_b0 = (ContentHandler *)0x0;
      if (this->fSAX2Handler != (SAX2Handler *)0x0) {
        local_b0 = &(this->fSAX2Handler->super_DefaultHandler).super_ContentHandler;
      }
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[8])(this->fSAX2Parser,local_b0);
      local_c8 = (ErrorHandler *)0x0;
      if (this->fSAX2Handler != (SAX2Handler *)0x0) {
        local_c8 = &(this->fSAX2Handler->super_DefaultHandler).super_ErrorHandler;
      }
      (*this->fSAX2Parser->_vptr_SAX2XMLReader[0xb])(this->fSAX2Parser,local_c8);
    }
    else {
      if (gp == (XMLGrammarPool *)0x0) {
        pSVar2 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,in_RSI);
        xercesc_4_0::SAXParser::SAXParser
                  (pSVar2,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                   (XMLGrammarPool *)0x0);
        this->fSAXParser = pSVar2;
      }
      else {
        pSVar2 = (SAXParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0x108,in_RSI);
        xercesc_4_0::SAXParser::SAXParser
                  (pSVar2,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,gp);
        this->fSAXParser = pSVar2;
        xercesc_4_0::SAXParser::cacheGrammarFromParse(SUB81(this->fSAXParser,0));
        xercesc_4_0::SAXParser::useCachedGrammarInParse(SUB81(this->fSAXParser,0));
      }
      xercesc_4_0::SAXParser::setValidationScheme((ValSchemes)this->fSAXParser);
      xercesc_4_0::SAXParser::setDoSchema(SUB81(this->fSAXParser,0));
      xercesc_4_0::SAXParser::setHandleMultipleImports(SUB81(this->fSAXParser,0));
      xercesc_4_0::SAXParser::setValidationSchemaFullChecking(SUB81(this->fSAXParser,0));
      xercesc_4_0::SAXParser::setDoNamespaces(SUB81(this->fSAXParser,0));
      this_01 = (SAXHandler *)operator_new(0x28);
      (this_01->super_HandlerBase).super_DocumentHandler._vptr_DocumentHandler = (_func_int **)0x0;
      (this_01->super_HandlerBase).super_ErrorHandler._vptr_ErrorHandler = (_func_int **)0x0;
      (this_01->super_HandlerBase).super_EntityResolver._vptr_EntityResolver = (_func_int **)0x0;
      (this_01->super_HandlerBase).super_DTDHandler._vptr_DTDHandler = (_func_int **)0x0;
      this_01->SAXInstance = (ThreadParser *)0x0;
      SAXHandler::SAXHandler(this_01);
      this->fSAXHandler = this_01;
      this->fSAXHandler->SAXInstance = this;
      local_70 = (DocumentHandler *)0x0;
      if (this->fSAXHandler != (SAXHandler *)0x0) {
        local_70 = &(this->fSAXHandler->super_HandlerBase).super_DocumentHandler;
      }
      (**(code **)(*(long *)this->fSAXParser + 0x20))(this->fSAXParser,local_70);
      local_88 = (ErrorHandler *)0x0;
      if (this->fSAXHandler != (SAXHandler *)0x0) {
        local_88 = &(this->fSAXHandler->super_HandlerBase).super_ErrorHandler;
      }
      (**(code **)(*(long *)this->fSAXParser + 0x28))(this->fSAXParser,local_88);
    }
  }
  else {
    if (gp == (XMLGrammarPool *)0x0) {
      pXVar1 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,in_RSI);
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (pXVar1,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,
                 (XMLGrammarPool *)0x0);
      this->fXercesDOMParser = pXVar1;
    }
    else {
      pXVar1 = (XercesDOMParser *)xercesc_4_0::XMemory::operator_new((XMemory *)0xd8,in_RSI);
      xercesc_4_0::XercesDOMParser::XercesDOMParser
                (pXVar1,(XMLValidator *)0x0,xercesc_4_0::XMLPlatformUtils::fgMemoryManager,gp);
      this->fXercesDOMParser = pXVar1;
      xercesc_4_0::XercesDOMParser::cacheGrammarFromParse(SUB81(this->fXercesDOMParser,0));
      xercesc_4_0::XercesDOMParser::useCachedGrammarInParse(SUB81(this->fXercesDOMParser,0));
    }
    if (gRunInfo.valScheme == Val_Never) {
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this->fXercesDOMParser);
    }
    else if (gRunInfo.valScheme == Val_Auto) {
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this->fXercesDOMParser);
    }
    else {
      xercesc_4_0::AbstractDOMParser::setValidationScheme((ValSchemes)this->fXercesDOMParser);
    }
    xercesc_4_0::AbstractDOMParser::setDoSchema(SUB81(this->fXercesDOMParser,0));
    xercesc_4_0::AbstractDOMParser::setHandleMultipleImports(SUB81(this->fXercesDOMParser,0));
    xercesc_4_0::AbstractDOMParser::setValidationSchemaFullChecking(SUB81(this->fXercesDOMParser,0))
    ;
    xercesc_4_0::AbstractDOMParser::setDoNamespaces(SUB81(this->fXercesDOMParser,0));
    this_00 = (HandlerBase *)operator_new(0x20);
    xercesc_4_0::HandlerBase::HandlerBase(this_00);
    local_50 = (ErrorHandler *)0x0;
    if (this_00 != (HandlerBase *)0x0) {
      local_50 = &this_00->super_ErrorHandler;
    }
    this->fDOMErrorHandler = local_50;
    xercesc_4_0::XercesDOMParser::setErrorHandler((ErrorHandler *)this->fXercesDOMParser);
  }
  return;
}

Assistant:

ThreadParser::ThreadParser()
{
    fSAXParser       = 0;
    fSAX2Parser      = 0;
    fXercesDOMParser = 0;
    fSAXHandler      = 0;
    fSAX2Handler     = 0;
    fDOMErrorHandler = 0;
    fDoc             = 0;
    fCheckSum        = 0;

    if (gRunInfo.dom) {
        // Set up to use a DOM parser
        /** Grammar caching thread testing */
        if (gp) {
            fXercesDOMParser = new XercesDOMParser(0, XMLPlatformUtils::fgMemoryManager, gp);
            fXercesDOMParser->cacheGrammarFromParse(true);
            fXercesDOMParser->useCachedGrammarInParse(true);
        }
        else {
            fXercesDOMParser = new XercesDOMParser;
        }
        switch (gRunInfo.valScheme) {
            case SAXParser::Val_Never:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Never);
                break;
            case SAXParser::Val_Auto:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Auto);
                break;
            default: //SAXParser::Val_Always:
                fXercesDOMParser->setValidationScheme(XercesDOMParser::Val_Always);
                break;
        }
        fXercesDOMParser->setDoSchema(gRunInfo.doSchema);
        fXercesDOMParser->setHandleMultipleImports (true);
        fXercesDOMParser->setValidationSchemaFullChecking(gRunInfo.schemaFullChecking);
        fXercesDOMParser->setDoNamespaces(gRunInfo.doNamespaces);
        fDOMErrorHandler = (ErrorHandler*) new HandlerBase();
        fXercesDOMParser->setErrorHandler(fDOMErrorHandler);
    }

    else if (gRunInfo.sax) {
        // Set up to use a SAX1 parser.
        /** Grammar caching thread testing */
        if (gp) {
            fSAXParser = new SAXParser(0, XMLPlatformUtils::fgMemoryManager, gp);
            fSAXParser->cacheGrammarFromParse(true);
            fSAXParser->useCachedGrammarInParse(true);
        }
        else {
            fSAXParser = new SAXParser();
        }
        fSAXParser->setValidationScheme(gRunInfo.valScheme);
        fSAXParser->setDoSchema(gRunInfo.doSchema);
        fSAXParser->setHandleMultipleImports (true);
        fSAXParser->setValidationSchemaFullChecking(gRunInfo.schemaFullChecking);
        fSAXParser->setDoNamespaces(gRunInfo.doNamespaces);
        fSAXHandler = new ThreadParser::SAXHandler();
        fSAXHandler->SAXInstance = this;
        fSAXParser->setDocumentHandler(fSAXHandler);
        fSAXParser->setErrorHandler(fSAXHandler);
    }

    else {
        // Set up to use a SAX2 parser.
        /** Grammar caching thread testing */
        if (gp) {
            fSAX2Parser = XMLReaderFactory::createXMLReader(gpMemMgr, gp);
            fSAX2Parser->setFeature(XMLUni::fgXercesCacheGrammarFromParse,true);
            fSAX2Parser->setFeature(XMLUni::fgXercesUseCachedGrammarInParse,true);
        }
        else {
            fSAX2Parser = XMLReaderFactory::createXMLReader();
        }

        fSAX2Parser->setFeature(XMLUni::fgSAX2CoreNameSpaces,(gRunInfo.doNamespaces));
        fSAX2Parser->setFeature(XMLUni::fgXercesSchema,(gRunInfo.doSchema));
        fSAX2Parser->setFeature(XMLUni::fgXercesHandleMultipleImports, true);
        fSAX2Parser->setFeature(XMLUni::fgXercesSchemaFullChecking,(gRunInfo.schemaFullChecking));

        switch (gRunInfo.valScheme) {
            case SAXParser::Val_Never:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, false);
                break;
            case SAXParser::Val_Auto:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
                fSAX2Parser->setFeature(XMLUni::fgXercesDynamic, true);
                break;
            default: //SAXParser::Val_Always:
                fSAX2Parser->setFeature(XMLUni::fgSAX2CoreValidation, true);
                fSAX2Parser->setFeature(XMLUni::fgXercesDynamic, false);
                break;
        }

        fSAX2Parser->setFeature(XMLUni::fgSAX2CoreNameSpacePrefixes,(gRunInfo.doNamespacePrefixes));
        fSAX2Handler = new ThreadParser::SAX2Handler();
        fSAX2Handler->SAX2Instance = this;
        fSAX2Parser->setContentHandler(fSAX2Handler);
        fSAX2Parser->setErrorHandler(fSAX2Handler);
    }
}